

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

uint32_t light_get_block_count(light_pcapng pcapng)

{
  uint32_t count;
  
  count = 0;
  for (; pcapng != (light_pcapng)0x0; pcapng = pcapng->next_block) {
    count = count + 1;
  }
  return count;
}

Assistant:

uint32_t light_get_block_count(const light_pcapng pcapng)
{
	uint32_t count = 0;
	light_pcapng iterator = pcapng;

	while (iterator != NULL) {
		count++;
		iterator = iterator->next_block;
	}

	return count;
}